

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_soft_max(ggml_compute_params *params,ggml_tensor *dst)

{
  int *piVar1;
  uint *puVar2;
  uint uVar3;
  float fVar4;
  undefined1 auVar5 [64];
  int iVar6;
  ggml_tensor *pgVar7;
  ggml_tensor *pgVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int64_t iVar12;
  size_t sVar13;
  void *pvVar14;
  size_t sVar15;
  void *pvVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  undefined8 uVar29;
  byte bVar30;
  byte bVar31;
  uint uVar32;
  uint uVar33;
  int iVar34;
  int iVar35;
  ulong uVar36;
  float *pfVar37;
  long lVar38;
  void *pvVar39;
  long lVar40;
  int iVar41;
  void *pvVar42;
  uint n;
  long lVar43;
  ulong uVar44;
  uint uVar45;
  float *x;
  ulong uVar46;
  bool bVar47;
  bool bVar48;
  ushort uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  float fVar58;
  float fVar59;
  ggml_float gVar60;
  undefined1 auVar61 [16];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var [60];
  undefined1 in_ZMM1 [64];
  undefined1 in_XMM7 [16];
  int np;
  __m512 vx;
  long local_168;
  
  auVar61 = in_ZMM1._0_16_;
  pgVar7 = dst->src[0];
  if (pgVar7->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1290,"fatal error");
  }
  pgVar8 = dst->src[1];
  uVar3 = dst->op_params[0];
  fVar4 = (float)dst->op_params[1];
  iVar6 = params->ith;
  iVar35 = params->nth;
  lVar9 = pgVar7->ne[0];
  lVar10 = pgVar7->ne[1];
  lVar11 = pgVar7->ne[2];
  auVar50 = vcvtusi2sd_avx512f(auVar61,(int)lVar11);
  auVar51._0_8_ = log2(auVar50._0_8_);
  auVar51._8_56_ = extraout_var_00;
  auVar50 = vroundsd_avx(auVar51._0_16_,auVar51._0_16_,9);
  uVar33 = vcvttsd2usi_avx512f(auVar50);
  uVar33 = 1 << (uVar33 & 0x1f);
  auVar50._8_4_ = 0x80000000;
  auVar50._0_8_ = 0x8000000080000000;
  auVar50._12_4_ = 0x80000000;
  auVar50 = vxorps_avx512vl(ZEXT416((uint)fVar4),auVar50);
  auVar61 = vcvtusi2ss_avx512f(auVar61,uVar33);
  fVar58 = exp2f(auVar50._0_4_ / auVar61._0_4_);
  fVar59 = exp2f((fVar4 * -0.5) / auVar61._0_4_);
  iVar12 = pgVar7->ne[0];
  iVar34 = ggml_nrows(pgVar7);
  iVar35 = (iVar35 + -1 + iVar34) / iVar35;
  iVar41 = iVar35 * iVar6;
  iVar35 = iVar35 + iVar41;
  if (iVar34 <= iVar35) {
    iVar35 = iVar34;
  }
  if (pgVar8 == (ggml_tensor *)0x0) {
    bVar48 = false;
  }
  else {
    bVar48 = pgVar8->type == GGML_TYPE_F16;
  }
  if (iVar41 < iVar35) {
    n = (uint)iVar12;
    lVar43 = (long)(int)n;
    x = (float *)((lVar43 + 0x10) * (long)iVar6 * 4 + (long)params->wdata);
    uVar46 = (ulong)(n & 0x7fffffff);
    uVar45 = n & 0xffffffc0;
    auVar51 = vbroadcastss_avx512f(ZEXT416(uVar3));
    lVar38 = (long)(int)uVar45;
    local_168 = (long)iVar41;
    if (lVar43 < lVar38 + 1) {
      lVar43 = lVar38 + 1;
    }
    auVar52 = vpbroadcastq_avx512f();
    uVar44 = (lVar43 - lVar38) + 0xfU & 0xfffffffffffffff0;
    auVar53 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar54 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar5 = vmovdqu64_avx512f(auVar52);
    do {
      auVar61 = SUB6416(ZEXT464(0x3f800000),0);
      if (0.0 < fVar4) {
        uVar3 = (uint)((local_168 / lVar10) % lVar11);
        bVar47 = uVar3 < uVar33;
        uVar32 = (uVar3 - uVar33) * 2;
        if (bVar47) {
          uVar32 = uVar3;
        }
        auVar61 = vcvtusi2ss_avx512f(in_XMM7,uVar32 + 1);
        auVar52._0_4_ =
             powf((float)((uint)bVar47 * (int)fVar58 + (uint)!bVar47 * (int)fVar59),auVar61._0_4_);
        auVar52._4_60_ = extraout_var;
        auVar61 = auVar52._0_16_;
        auVar54 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar53 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar52 = vmovdqu64_avx512f(auVar5);
      }
      sVar13 = dst->nb[1];
      pvVar14 = dst->data;
      sVar15 = pgVar7->nb[1];
      pvVar16 = pgVar7->data;
      if (pgVar8 == (ggml_tensor *)0x0) {
        pvVar39 = (void *)0x0;
        pvVar42 = (void *)0x0;
      }
      else {
        pvVar39 = (void *)((local_168 % lVar10) * lVar9 * 2 + (long)pgVar8->data);
        pvVar42 = (void *)((local_168 % lVar10) * lVar9 * 4 + (long)pgVar8->data);
      }
      if (0 < (int)n) {
        uVar36 = 0;
        do {
          x[uVar36] = *(float *)((long)pvVar16 + uVar36 * 4 + sVar15 * local_168);
          uVar36 = uVar36 + 1;
        } while (uVar46 != uVar36);
      }
      if (0 < (int)uVar45) {
        uVar36 = 0;
        pfVar37 = x;
        do {
          lVar43 = 0;
          do {
            auVar55 = vmulps_avx512f(auVar51,*(undefined1 (*) [64])((long)pfVar37 + lVar43));
            *(undefined1 (*) [64])((long)pfVar37 + lVar43) = auVar55;
            lVar43 = lVar43 + 0x40;
          } while (lVar43 != 0x100);
          uVar36 = uVar36 + 0x40;
          pfVar37 = pfVar37 + 0x40;
        } while (uVar36 < (n & 0xffffffc0));
      }
      if (uVar45 != n) {
        uVar36 = 0;
        do {
          auVar55 = vpbroadcastq_avx512f();
          auVar56 = vporq_avx512f(auVar55,auVar53);
          auVar55 = vporq_avx512f(auVar55,auVar54);
          uVar29 = vpcmpuq_avx512f(auVar55,auVar52,2);
          bVar30 = (byte)uVar29;
          uVar29 = vpcmpuq_avx512f(auVar56,auVar52,2);
          bVar31 = (byte)uVar29;
          uVar49 = CONCAT11(bVar31,bVar30);
          pfVar37 = x + lVar38 + uVar36;
          auVar55._4_4_ = (uint)((byte)(uVar49 >> 1) & 1) * (int)pfVar37[1];
          auVar55._0_4_ = (uint)(bVar30 & 1) * (int)*pfVar37;
          auVar55._8_4_ = (uint)((byte)(uVar49 >> 2) & 1) * (int)pfVar37[2];
          auVar55._12_4_ = (uint)((byte)(uVar49 >> 3) & 1) * (int)pfVar37[3];
          auVar55._16_4_ = (uint)((byte)(uVar49 >> 4) & 1) * (int)pfVar37[4];
          auVar55._20_4_ = (uint)((byte)(uVar49 >> 5) & 1) * (int)pfVar37[5];
          auVar55._24_4_ = (uint)((byte)(uVar49 >> 6) & 1) * (int)pfVar37[6];
          auVar55._28_4_ = (uint)((byte)(uVar49 >> 7) & 1) * (int)pfVar37[7];
          auVar55._32_4_ = (uint)(bVar31 & 1) * (int)pfVar37[8];
          auVar55._36_4_ = (uint)(bVar31 >> 1 & 1) * (int)pfVar37[9];
          auVar55._40_4_ = (uint)(bVar31 >> 2 & 1) * (int)pfVar37[10];
          auVar55._44_4_ = (uint)(bVar31 >> 3 & 1) * (int)pfVar37[0xb];
          auVar55._48_4_ = (uint)(bVar31 >> 4 & 1) * (int)pfVar37[0xc];
          auVar55._52_4_ = (uint)(bVar31 >> 5 & 1) * (int)pfVar37[0xd];
          auVar55._56_4_ = (uint)(bVar31 >> 6 & 1) * (int)pfVar37[0xe];
          auVar55._60_4_ = (uint)(bVar31 >> 7) * (int)pfVar37[0xf];
          auVar55 = vmulps_avx512f(auVar51,auVar55);
          pfVar37 = x + lVar38 + uVar36;
          bVar47 = (bool)((byte)(uVar49 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar49 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar49 >> 3) & 1);
          bVar19 = (bool)((byte)(uVar49 >> 4) & 1);
          bVar20 = (bool)((byte)(uVar49 >> 5) & 1);
          bVar21 = (bool)((byte)(uVar49 >> 6) & 1);
          bVar22 = (bool)((byte)(uVar49 >> 7) & 1);
          bVar23 = (bool)(bVar31 >> 1 & 1);
          bVar24 = (bool)(bVar31 >> 2 & 1);
          bVar25 = (bool)(bVar31 >> 3 & 1);
          bVar26 = (bool)(bVar31 >> 4 & 1);
          bVar27 = (bool)(bVar31 >> 5 & 1);
          bVar28 = (bool)(bVar31 >> 6 & 1);
          *pfVar37 = (float)((uint)(bVar30 & 1) * auVar55._0_4_ |
                            (uint)!(bool)(bVar30 & 1) * (int)*pfVar37);
          pfVar37[1] = (float)((uint)bVar47 * auVar55._4_4_ | (uint)!bVar47 * (int)pfVar37[1]);
          pfVar37[2] = (float)((uint)bVar17 * auVar55._8_4_ | (uint)!bVar17 * (int)pfVar37[2]);
          pfVar37[3] = (float)((uint)bVar18 * auVar55._12_4_ | (uint)!bVar18 * (int)pfVar37[3]);
          pfVar37[4] = (float)((uint)bVar19 * auVar55._16_4_ | (uint)!bVar19 * (int)pfVar37[4]);
          pfVar37[5] = (float)((uint)bVar20 * auVar55._20_4_ | (uint)!bVar20 * (int)pfVar37[5]);
          pfVar37[6] = (float)((uint)bVar21 * auVar55._24_4_ | (uint)!bVar21 * (int)pfVar37[6]);
          pfVar37[7] = (float)((uint)bVar22 * auVar55._28_4_ | (uint)!bVar22 * (int)pfVar37[7]);
          pfVar37[8] = (float)((uint)(bVar31 & 1) * auVar55._32_4_ |
                              (uint)!(bool)(bVar31 & 1) * (int)pfVar37[8]);
          pfVar37[9] = (float)((uint)bVar23 * auVar55._36_4_ | (uint)!bVar23 * (int)pfVar37[9]);
          pfVar37[10] = (float)((uint)bVar24 * auVar55._40_4_ | (uint)!bVar24 * (int)pfVar37[10]);
          pfVar37[0xb] = (float)((uint)bVar25 * auVar55._44_4_ | (uint)!bVar25 * (int)pfVar37[0xb]);
          pfVar37[0xc] = (float)((uint)bVar26 * auVar55._48_4_ | (uint)!bVar26 * (int)pfVar37[0xc]);
          pfVar37[0xd] = (float)((uint)bVar27 * auVar55._52_4_ | (uint)!bVar27 * (int)pfVar37[0xd]);
          pfVar37[0xe] = (float)((uint)bVar28 * auVar55._56_4_ | (uint)!bVar28 * (int)pfVar37[0xe]);
          pfVar37[0xf] = (float)((uint)(bVar31 >> 7) * auVar55._60_4_ |
                                (uint)!(bool)(bVar31 >> 7) * (int)pfVar37[0xf]);
          uVar36 = uVar36 + 0x10;
        } while (uVar44 != uVar36);
      }
      if (pvVar42 == (void *)0x0) {
LAB_0013e257:
        auVar50 = SUB6416(ZEXT464(0xff800000),0);
        if (0 < (int)n) {
          uVar36 = 0;
          auVar52 = ZEXT464(0xff800000);
          do {
            auVar50 = vmaxss_avx(auVar52._0_16_,ZEXT416((uint)x[uVar36]));
            auVar52 = ZEXT1664(auVar50);
            uVar36 = uVar36 + 1;
          } while (uVar46 != uVar36);
        }
      }
      else if (bVar48) {
        auVar50 = SUB6416(ZEXT464(0xff800000),0);
        if (0 < (int)n) {
          uVar36 = 0;
          do {
            auVar50 = vfmadd213ss_fma(ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                       (ulong)*(ushort *)
                                                               ((long)pvVar39 + uVar36 * 2) * 4)),
                                      auVar61,ZEXT416((uint)x[uVar36]));
            x[uVar36] = auVar50._0_4_;
            uVar36 = uVar36 + 1;
          } while (uVar46 != uVar36);
          goto LAB_0013e257;
        }
      }
      else {
        auVar50 = SUB6416(ZEXT464(0xff800000),0);
        if (0 < (int)n) {
          uVar36 = 0;
          do {
            auVar50 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)pvVar42 + uVar36 * 4)),auVar61,
                                      ZEXT416((uint)x[uVar36]));
            x[uVar36] = auVar50._0_4_;
            uVar36 = uVar36 + 1;
          } while (uVar46 != uVar36);
          goto LAB_0013e257;
        }
      }
      lVar43 = sVar13 * local_168;
      pfVar37 = (float *)((long)pvVar14 + lVar43);
      gVar60 = ggml_vec_soft_max_f32(n,pfVar37,x,auVar50._0_4_);
      auVar54 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar53 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar52 = vmovdqu64_avx512f(auVar5);
      auVar61._0_4_ = (float)(1.0 / gVar60);
      auVar61._4_4_ = (int)((ulong)(1.0 / gVar60) >> 0x20);
      auVar61._8_8_ = 0;
      auVar55 = vbroadcastss_avx512f(auVar61);
      if (0 < (int)uVar45) {
        uVar36 = 0;
        do {
          lVar40 = 0;
          do {
            auVar56 = vmulps_avx512f(auVar55,*(undefined1 (*) [64])((long)pfVar37 + lVar40));
            *(undefined1 (*) [64])((long)pfVar37 + lVar40) = auVar56;
            lVar40 = lVar40 + 0x40;
          } while (lVar40 != 0x100);
          uVar36 = uVar36 + 0x40;
          pfVar37 = pfVar37 + 0x40;
        } while (uVar36 < (n & 0xffffffc0));
      }
      if (uVar45 != n) {
        lVar43 = lVar43 + lVar38 * 4;
        uVar36 = 0;
        do {
          auVar56 = vpbroadcastq_avx512f();
          auVar57 = vporq_avx512f(auVar56,auVar53);
          auVar56 = vporq_avx512f(auVar56,auVar54);
          uVar29 = vpcmpuq_avx512f(auVar56,auVar52,2);
          bVar30 = (byte)uVar29;
          uVar29 = vpcmpuq_avx512f(auVar57,auVar52,2);
          bVar31 = (byte)uVar29;
          uVar49 = CONCAT11(bVar31,bVar30);
          piVar1 = (int *)((long)pvVar14 + uVar36 * 4 + lVar43);
          auVar56._4_4_ = (uint)((byte)(uVar49 >> 1) & 1) * piVar1[1];
          auVar56._0_4_ = (uint)(bVar30 & 1) * *piVar1;
          auVar56._8_4_ = (uint)((byte)(uVar49 >> 2) & 1) * piVar1[2];
          auVar56._12_4_ = (uint)((byte)(uVar49 >> 3) & 1) * piVar1[3];
          auVar56._16_4_ = (uint)((byte)(uVar49 >> 4) & 1) * piVar1[4];
          auVar56._20_4_ = (uint)((byte)(uVar49 >> 5) & 1) * piVar1[5];
          auVar56._24_4_ = (uint)((byte)(uVar49 >> 6) & 1) * piVar1[6];
          auVar56._28_4_ = (uint)((byte)(uVar49 >> 7) & 1) * piVar1[7];
          auVar56._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
          auVar56._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
          auVar56._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
          auVar56._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
          auVar56._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
          auVar56._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
          auVar56._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
          auVar56._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
          auVar56 = vmulps_avx512f(auVar56,auVar55);
          puVar2 = (uint *)((long)pvVar14 + uVar36 * 4 + lVar43);
          bVar47 = (bool)((byte)(uVar49 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar49 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar49 >> 3) & 1);
          bVar19 = (bool)((byte)(uVar49 >> 4) & 1);
          bVar20 = (bool)((byte)(uVar49 >> 5) & 1);
          bVar21 = (bool)((byte)(uVar49 >> 6) & 1);
          bVar22 = (bool)((byte)(uVar49 >> 7) & 1);
          bVar23 = (bool)(bVar31 >> 1 & 1);
          bVar24 = (bool)(bVar31 >> 2 & 1);
          bVar25 = (bool)(bVar31 >> 3 & 1);
          bVar26 = (bool)(bVar31 >> 4 & 1);
          bVar27 = (bool)(bVar31 >> 5 & 1);
          bVar28 = (bool)(bVar31 >> 6 & 1);
          *puVar2 = (uint)(bVar30 & 1) * auVar56._0_4_ | (uint)!(bool)(bVar30 & 1) * *puVar2;
          puVar2[1] = (uint)bVar47 * auVar56._4_4_ | (uint)!bVar47 * puVar2[1];
          puVar2[2] = (uint)bVar17 * auVar56._8_4_ | (uint)!bVar17 * puVar2[2];
          puVar2[3] = (uint)bVar18 * auVar56._12_4_ | (uint)!bVar18 * puVar2[3];
          puVar2[4] = (uint)bVar19 * auVar56._16_4_ | (uint)!bVar19 * puVar2[4];
          puVar2[5] = (uint)bVar20 * auVar56._20_4_ | (uint)!bVar20 * puVar2[5];
          puVar2[6] = (uint)bVar21 * auVar56._24_4_ | (uint)!bVar21 * puVar2[6];
          puVar2[7] = (uint)bVar22 * auVar56._28_4_ | (uint)!bVar22 * puVar2[7];
          puVar2[8] = (uint)(bVar31 & 1) * auVar56._32_4_ | (uint)!(bool)(bVar31 & 1) * puVar2[8];
          puVar2[9] = (uint)bVar23 * auVar56._36_4_ | (uint)!bVar23 * puVar2[9];
          puVar2[10] = (uint)bVar24 * auVar56._40_4_ | (uint)!bVar24 * puVar2[10];
          puVar2[0xb] = (uint)bVar25 * auVar56._44_4_ | (uint)!bVar25 * puVar2[0xb];
          puVar2[0xc] = (uint)bVar26 * auVar56._48_4_ | (uint)!bVar26 * puVar2[0xc];
          puVar2[0xd] = (uint)bVar27 * auVar56._52_4_ | (uint)!bVar27 * puVar2[0xd];
          puVar2[0xe] = (uint)bVar28 * auVar56._56_4_ | (uint)!bVar28 * puVar2[0xe];
          puVar2[0xf] = (uint)(bVar31 >> 7) * auVar56._60_4_ |
                        (uint)!(bool)(bVar31 >> 7) * puVar2[0xf];
          uVar36 = uVar36 + 0x10;
        } while (uVar44 != uVar36);
      }
      local_168 = local_168 + 1;
    } while (iVar35 != (int)local_168);
  }
  return;
}

Assistant:

void ggml_compute_forward_soft_max(
        const ggml_compute_params * params,
              ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_soft_max_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}